

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  ulong *puVar1;
  secp256k1_fe *a_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint64_t uVar45;
  uint64_t uVar46;
  uint64_t uVar47;
  uint64_t uVar48;
  int iVar49;
  int iVar50;
  undefined1 *puVar51;
  ulong uVar52;
  long extraout_RDX;
  ulong uVar53;
  secp256k1_fe *a_01;
  secp256k1_fe *psVar54;
  ulong uVar55;
  secp256k1_ge *a_02;
  ulong uVar56;
  secp256k1_gej *a_03;
  undefined4 in_register_0000003c;
  secp256k1_ge *r;
  ulong uVar57;
  secp256k1_gej *r_00;
  secp256k1_gej *r_01;
  long lVar58;
  undefined1 *puVar59;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  undefined1 auStack_2b0 [128];
  ulong uStack_230;
  ulong uStack_228;
  ulong uStack_220;
  long lStack_218;
  undefined8 uStack_210;
  secp256k1_gej local_1c8;
  secp256k1_gej local_130;
  secp256k1_ge local_98;
  
  r = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double_var(&local_130,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&local_98,&local_130.x,&local_130.y);
    secp256k1_ge_set_gej_zinv(r,(secp256k1_gej *)z,&local_130.z);
    secp256k1_gej_set_ge(&local_1c8,r);
    local_1c8.z.n[0] = z[2].n[0];
    local_1c8.z.n[1] = z[2].n[1];
    local_1c8.z.n[2] = z[2].n[2];
    local_1c8.z.n[3] = z[2].n[3];
    local_1c8.z.n[4] = z[2].n[4];
    local_1c8.z.magnitude = z[2].magnitude;
    local_1c8.z.normalized = z[2].normalized;
    (pre_a->x).n[4] = local_130.z.n[4];
    (pre_a->x).magnitude = local_130.z.magnitude;
    (pre_a->x).normalized = local_130.z.normalized;
    (pre_a->x).n[2] = local_130.z.n[2];
    (pre_a->x).n[3] = local_130.z.n[3];
    (pre_a->x).n[0] = local_130.z.n[0];
    (pre_a->x).n[1] = local_130.z.n[1];
    lVar58 = 0x30;
    do {
      r = r + 1;
      secp256k1_gej_add_ge_var
                (&local_1c8,&local_1c8,&local_98,(secp256k1_fe *)((long)(pre_a->x).n + lVar58));
      secp256k1_ge_set_xy(r,&local_1c8.x,&local_1c8.y);
      lVar58 = lVar58 + 0x30;
    } while (lVar58 != 0x180);
    secp256k1_fe_mul(zr,&local_1c8.z,&local_130.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  puVar51 = &r[-1].field_0x67;
  if (r != (secp256k1_ge *)0x0) {
    secp256k1_ge_verify(pre_a + (long)puVar51);
    lVar58 = (long)puVar51 * 0x30;
    secp256k1_fe_verify((secp256k1_fe *)(extraout_RDX + lVar58));
    psVar54 = &pre_a[(long)puVar51].y;
    secp256k1_fe_verify(psVar54);
    uVar55 = pre_a[(long)puVar51].y.n[4];
    uVar53 = (uVar55 >> 0x30) * 0x1000003d1 + psVar54->n[0];
    uVar52 = (uVar53 >> 0x34) + pre_a[(long)puVar51].y.n[1];
    uVar56 = (uVar52 >> 0x34) + pre_a[(long)puVar51].y.n[2];
    uVar57 = (uVar56 >> 0x34) + pre_a[(long)puVar51].y.n[3];
    a_03 = (secp256k1_gej *)(uVar56 & 0xfffffffffffff);
    psVar54->n[0] = uVar53 & 0xfffffffffffff;
    pre_a[(long)puVar51].y.n[1] = uVar52 & 0xfffffffffffff;
    pre_a[(long)puVar51].y.n[2] = (uint64_t)a_03;
    pre_a[(long)puVar51].y.n[3] = uVar57 & 0xfffffffffffff;
    pre_a[(long)puVar51].y.n[4] = (uVar57 >> 0x34) + (uVar55 & 0xffffffffffff);
    pre_a[(long)puVar51].y.magnitude = 1;
    secp256k1_fe_verify(psVar54);
    auStack_2b0._0_8_ = *(ulong *)(extraout_RDX + lVar58);
    auStack_2b0._8_8_ = ((ulong *)(extraout_RDX + lVar58))[1];
    puVar1 = (ulong *)(extraout_RDX + 0x10 + lVar58);
    auStack_2b0._16_8_ = *puVar1;
    auStack_2b0._24_8_ = puVar1[1];
    puVar1 = (ulong *)(extraout_RDX + 0x20 + lVar58);
    auStack_2b0._32_8_ = *puVar1;
    auStack_2b0._40_8_ = puVar1[1];
    if (puVar51 != (undefined1 *)0x0) {
      a_02 = pre_a + (long)&r[-1].field_0x66;
      psVar54 = (secp256k1_fe *)(extraout_RDX + (long)r * 0x30);
      puVar59 = (undefined1 *)0x0;
      do {
        r_01 = (secp256k1_gej *)auStack_2b0;
        psVar54 = psVar54 + -1;
        secp256k1_fe_verify(psVar54);
        secp256k1_ge_verify(a_02 + 1);
        if (puVar59 != (undefined1 *)0x0) {
          a_03 = r_01;
          secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,psVar54);
        }
        secp256k1_ge_verify(a_02);
        r_00 = r_01;
        secp256k1_fe_verify((secp256k1_fe *)r_01);
        if (a_02->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
LAB_0014b378:
          secp256k1_ge_table_set_globalz_cold_2();
          secp256k1_gej_verify(a_03);
          if (a_03->infinity == 0) {
            if (a_01 != (secp256k1_fe *)0x0) {
              uVar45 = (a_03->y).n[0];
              uVar46 = (a_03->y).n[1];
              uVar47 = (a_03->y).n[2];
              uVar48 = (a_03->y).n[3];
              iVar49 = (a_03->y).magnitude;
              iVar50 = (a_03->y).normalized;
              a_01->n[4] = (a_03->y).n[4];
              a_01->magnitude = iVar49;
              a_01->normalized = iVar50;
              a_01->n[2] = uVar47;
              a_01->n[3] = uVar48;
              a_01->n[0] = uVar45;
              a_01->n[1] = uVar46;
              secp256k1_fe_verify(a_01);
              uVar55 = a_01->n[4];
              uVar53 = (uVar55 >> 0x30) * 0x1000003d1 + a_01->n[0];
              uVar52 = (uVar53 >> 0x34) + a_01->n[1];
              uVar56 = (uVar52 >> 0x34) + a_01->n[2];
              uVar57 = (uVar56 >> 0x34) + a_01->n[3];
              a_01->n[0] = uVar53 & 0xfffffffffffff;
              a_01->n[1] = uVar52 & 0xfffffffffffff;
              a_01->n[2] = uVar56 & 0xfffffffffffff;
              a_01->n[3] = uVar57 & 0xfffffffffffff;
              a_01->n[4] = (uVar57 >> 0x34) + (uVar55 & 0xffffffffffff);
              a_01->magnitude = 1;
              secp256k1_fe_verify(a_01);
            }
            secp256k1_gej_double(r_00,a_03);
            secp256k1_gej_verify(r_00);
            return;
          }
          secp256k1_gej_set_infinity(r_00);
          if (a_01 != (secp256k1_fe *)0x0) {
            a_01->n[0] = 1;
            a_01->n[1] = 0;
            a_01->n[2] = 0;
            a_01->n[3] = 0;
            a_01->n[4] = 0;
            a_01->magnitude = 1;
            a_01->normalized = 1;
            secp256k1_fe_verify(a_01);
            return;
          }
          return;
        }
        secp256k1_fe_verify((secp256k1_fe *)r_01);
        r_00 = r_01;
        if (8 < (int)auStack_2b0._40_4_) goto LAB_0014b378;
        a_00 = (secp256k1_fe *)(auStack_2b0 + 0x78);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auStack_2b0._0_8_ * 2;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auStack_2b0._24_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auStack_2b0._8_8_ * 2;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auStack_2b0._16_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auStack_2b0._32_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auStack_2b0._32_8_;
        uVar52 = SUB168(auVar4 * auVar24,0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar52 & 0xfffffffffffff;
        auVar2 = auVar3 * auVar23 + auVar2 * auVar22 + auVar5 * ZEXT816(0x1000003d10);
        uVar55 = auVar2._0_8_;
        auStack_2b0._72_8_ = uVar55 & 0xfffffffffffff;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar55 >> 0x34 | auVar2._8_8_ << 0xc;
        uVar55 = auStack_2b0._32_8_ * 2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auStack_2b0._0_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar55;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auStack_2b0._8_8_ * 2;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = auStack_2b0._24_8_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auStack_2b0._16_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auStack_2b0._16_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar52 >> 0x34 | SUB168(auVar4 * auVar24,8) << 0xc;
        auVar2 = auVar6 * auVar25 + auVar38 + auVar7 * auVar26 + auVar8 * auVar27 +
                 auVar9 * ZEXT816(0x1000003d10);
        auStack_2b0._64_8_ = auVar2._0_8_;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (ulong)auStack_2b0._64_8_ >> 0x34 | auVar2._8_8_ << 0xc;
        auStack_2b0._56_8_ = (auStack_2b0._64_8_ & 0xfffffffffffff) >> 0x30;
        auStack_2b0._64_8_ = auStack_2b0._64_8_ & 0xffffffffffff;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auStack_2b0._0_8_;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = auStack_2b0._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auStack_2b0._8_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar55;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auStack_2b0._16_8_ * 2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = auStack_2b0._24_8_;
        auVar2 = auVar11 * auVar29 + auVar39 + auVar12 * auVar30;
        uVar52 = auVar2._0_8_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar52 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (uVar52 & 0xfffffffffffff) << 4 | auStack_2b0._56_8_;
        auVar2 = auVar10 * auVar28 + ZEXT816(0x1000003d1) * auVar31;
        uVar52 = auVar2._0_8_;
        auStack_2b0._120_8_ = uVar52 & 0xfffffffffffff;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar52 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auStack_2b0._0_8_ * 2;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = auStack_2b0._8_8_;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auStack_2b0._16_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar55;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auStack_2b0._24_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = auStack_2b0._24_8_;
        auVar3 = auVar14 * auVar33 + auVar41 + auVar15 * auVar34;
        uVar52 = auVar3._0_8_;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar52 & 0xfffffffffffff;
        auVar2 = auVar13 * auVar32 + auVar40 + auVar16 * ZEXT816(0x1000003d10);
        uVar53 = auVar2._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar52 >> 0x34 | auVar3._8_8_ << 0xc;
        uStack_230 = uVar53 & 0xfffffffffffff;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar53 >> 0x34 | auVar2._8_8_ << 0xc;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auStack_2b0._0_8_ * 2;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auStack_2b0._16_8_;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auStack_2b0._8_8_;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auStack_2b0._8_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auStack_2b0._24_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar55;
        auVar43 = auVar19 * auVar37 + auVar43;
        uVar55 = auVar43._0_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar55 & 0xfffffffffffff;
        auVar2 = auVar17 * auVar35 + auVar42 + auVar18 * auVar36 + auVar20 * ZEXT816(0x1000003d10);
        uVar52 = auVar2._0_8_;
        uStack_228 = uVar52 & 0xfffffffffffff;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (uVar52 >> 0x34 | auVar2._8_8_ << 0xc) + auStack_2b0._72_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar55 >> 0x34 | auVar43._8_8_ << 0xc;
        auVar44 = auVar21 * ZEXT816(0x1000003d10) + auVar44;
        uVar55 = auVar44._0_8_;
        uStack_220 = uVar55 & 0xfffffffffffff;
        lStack_218 = (uVar55 >> 0x34 | auVar44._8_8_ << 0xc) + auStack_2b0._64_8_;
        uStack_210 = 1;
        secp256k1_fe_verify(a_00);
        secp256k1_fe_mul((secp256k1_fe *)(auStack_2b0 + 0x48),a_00,(secp256k1_fe *)auStack_2b0);
        secp256k1_fe_mul(&a_02->x,&a_02->x,a_00);
        a_03 = (secp256k1_gej *)&a_02->y;
        secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)a_03,
                         (secp256k1_fe *)(auStack_2b0 + 0x48));
        secp256k1_ge_verify(a_02);
        secp256k1_ge_verify(a_02);
        puVar59 = puVar59 + 1;
        a_02 = a_02 + -1;
      } while (puVar51 != puVar59);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}